

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

MOJOSHADER_astDataType * find_variable(Context_conflict *ctx,char *sym,int *_index)

{
  MOJOSHADER_astDataType *pMVar1;
  int *_index_local;
  char *sym_local;
  Context_conflict *ctx_local;
  
  pMVar1 = find_symbol(ctx,&ctx->variables,sym,_index);
  return pMVar1;
}

Assistant:

static inline const MOJOSHADER_astDataType *find_variable(Context *ctx, const char *sym, int *_index)
{
    return find_symbol(ctx, &ctx->variables, sym, _index);
}